

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathQuaternion.cpp
# Opt level: O1

void COLLADABU::Math::Quaternion::intermediate
               (Quaternion *rkQ0,Quaternion *rkQ1,Quaternion *rkQ2,Quaternion *rkA,Quaternion *rkB)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar16;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar17;
  double dVar18;
  double dVar19;
  Quaternion local_70;
  Quaternion local_50;
  
  dVar7 = log(&local_50,rkQ1->z * rkQ2->z);
  log(&local_70,dVar7);
  dVar18 = (local_50.x - local_70.x) * 0.25;
  dVar10 = (local_50.y - local_70.y) * 0.25;
  dVar16 = (local_50.z - local_70.z) * 0.25;
  dVar19 = dVar18 * dVar18 + dVar10 * dVar10;
  dVar7 = dVar16 * dVar16 + dVar19;
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  dVar11 = -dVar18;
  dVar8 = sin(dVar7);
  dVar9 = cos(dVar7);
  dVar7 = dVar8 / dVar7;
  if (ABS(dVar8) >= 0.001) {
    dVar18 = dVar18 * dVar7;
  }
  uVar6 = (uint)(ABS(dVar8) < 0.001);
  auVar13._0_4_ = (int)(uVar6 << 0x1f) >> 0x1f;
  auVar13._4_4_ = (int)(uVar6 << 0x1f) >> 0x1f;
  auVar13._8_4_ = (int)(uVar6 << 0x1f) >> 0x1f;
  auVar13._12_4_ = (int)(uVar6 << 0x1f) >> 0x1f;
  auVar5._8_8_ = dVar16;
  auVar5._0_8_ = dVar10;
  auVar14._8_8_ = dVar7 * dVar16;
  auVar14._0_8_ = dVar7 * dVar10;
  auVar14 = ~auVar13 & auVar14 | auVar5 & auVar13;
  dVar17 = rkQ1->w;
  dVar1 = rkQ1->x;
  dVar2 = rkQ1->y;
  dVar3 = rkQ1->y;
  dVar4 = rkQ1->z;
  dVar7 = rkQ1->z;
  dVar8 = auVar14._8_8_;
  dVar12 = auVar14._0_8_;
  rkA->w = (-dVar2 * dVar12 + dVar9 * dVar17 + -dVar1 * dVar18) - dVar7 * dVar8;
  rkA->x = (dVar2 * dVar8 + dVar18 * dVar17 + dVar1 * dVar9) - dVar7 * dVar12;
  rkA->y = (dVar18 * dVar7 + dVar17 * dVar12 + dVar9 * dVar3) - dVar8 * dVar1;
  rkA->z = (dVar12 * dVar1 + dVar17 * dVar8 + dVar9 * dVar4) - dVar18 * dVar2;
  dVar19 = dVar16 * dVar16 + dVar19;
  if (dVar19 < 0.0) {
    dVar19 = sqrt(dVar19);
  }
  else {
    dVar19 = SQRT(dVar19);
  }
  dVar7 = sin(dVar19);
  dVar18 = cos(dVar19);
  dVar19 = dVar7 / dVar19;
  if (ABS(dVar7) >= 0.001) {
    dVar11 = dVar11 * dVar19;
  }
  uVar6 = (uint)(ABS(dVar7) < 0.001);
  auVar15._0_8_ = CONCAT44((int)(uVar6 << 0x1f) >> 0x1f,(int)(uVar6 << 0x1f) >> 0x1f);
  auVar15._8_4_ = (int)(uVar6 << 0x1f) >> 0x1f;
  auVar15._12_4_ = (int)(uVar6 << 0x1f) >> 0x1f;
  dVar12 = (double)(~auVar15._0_8_ & (ulong)(dVar19 * -dVar10) | (ulong)-dVar10 & auVar15._0_8_);
  dVar17 = (double)(~auVar15._8_8_ & (ulong)(dVar19 * -dVar16) | (ulong)-dVar16 & auVar15._8_8_);
  dVar19 = rkQ1->w;
  dVar10 = rkQ1->x;
  dVar16 = rkQ1->y;
  dVar8 = rkQ1->y;
  dVar9 = rkQ1->z;
  dVar7 = rkQ1->z;
  rkB->w = (-dVar16 * dVar12 + dVar18 * dVar19 + -dVar10 * dVar11) - dVar7 * dVar17;
  rkB->x = (dVar16 * dVar17 + dVar11 * dVar19 + dVar10 * dVar18) - dVar7 * dVar12;
  rkB->y = (dVar11 * dVar7 + dVar19 * dVar12 + dVar18 * dVar8) - dVar17 * dVar10;
  rkB->z = (dVar12 * dVar10 + dVar19 * dVar17 + dVar18 * dVar9) - dVar11 * dVar16;
  return;
}

Assistant:

void Quaternion::intermediate ( const Quaternion& rkQ0,
                                        const Quaternion& rkQ1, const Quaternion& rkQ2,
                                        Quaternion& rkA, Quaternion& rkB )
        {
            // assert:  q0, q1, q2 are unit quaternions

            Quaternion kQ0inv = rkQ0.unitInverse();
            Quaternion kQ1inv = rkQ1.unitInverse();
            Quaternion rkP0 = kQ0inv * rkQ1;
            Quaternion rkP1 = kQ1inv * rkQ2;
            Quaternion kArg = 0.25 * ( rkP0.log() - rkP1.log() );
            Quaternion kMinusArg = -kArg;

            rkA = rkQ1 * kArg.exp();
            rkB = rkQ1 * kMinusArg.exp();
        }